

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O2

int match_tcp(void *data,packet_t *pkt)

{
  byte bVar1;
  tcp_t *ptVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if ((pkt->ip_proto == '\x06') && (ptVar2 = pkt->tcp, uVar4 = uVar3, ptVar2 != (tcp_t *)0x0)) {
    uVar3 = match_port(ptVar2->src << 8 | ptVar2->src >> 8,(uint16_t *)data);
    bVar1 = *(byte *)((long)data + 0xb);
    if (uVar3 != (bVar1 & 1)) {
      uVar3 = match_port(ptVar2->dst << 8 | ptVar2->dst >> 8,(uint16_t *)((long)data + 4));
      if (uVar3 != ((bVar1 >> 1 & 1) != 0)) {
        uVar4 = (uint)(((bVar1 & 8) == 0) !=
                      ((*(byte *)((long)data + 10) & ptVar2->flag) != *(byte *)((long)data + 9)));
      }
    }
  }
  return uVar4;
}

Assistant:

static int match_tcp(void *data, packet_t *pkt)
{
	match_tcp_t *m = (match_tcp_t *)data;

	if (pkt->ip_proto != IPPROTO_TCP || pkt->tcp == NULL) {
		return 0;
	}

	if (INVF(m, INV_TCP_SRC, !match_port(ntohs(pkt->tcp->src), m->src))) {
		return 0;
	}

	if (INVF(m, INV_TCP_DST, !match_port(ntohs(pkt->tcp->dst), m->dst))) {
		return 0;
	}

	if (INVF(m, INV_TCP_FLAG, !((pkt->tcp->flag & m->flag_mask) == m->flag))) {
		return 0;
	}

	return 1;
}